

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KinDynComputations.cpp
# Opt level: O0

bool __thiscall
iDynTree::KinDynComputations::getFrameFreeFloatingJacobianSparsityPattern
          (KinDynComputations *this,FrameIndex frameIndex,MatrixDynSize *outJacobianPattern)

{
  bool bVar1;
  ulong in_RDX;
  MatrixView<double> *in_stack_00000588;
  FrameIndex in_stack_00000590;
  KinDynComputations *in_stack_00000598;
  uint in_stack_ffffffffffffffb0;
  MatrixDynSize *in_stack_ffffffffffffffb8;
  MatrixView<double> *in_stack_ffffffffffffffc0;
  
  getNrOfDegreesOfFreedom((KinDynComputations *)0x1c7c7b);
  iDynTree::MatrixDynSize::resize(in_RDX,6);
  MatrixView<double>::MatrixView<iDynTree::MatrixDynSize,_0>
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
             (MatrixStorageOrdering *)(ulong)in_stack_ffffffffffffffb0);
  bVar1 = getFrameFreeFloatingJacobianSparsityPattern
                    (in_stack_00000598,in_stack_00000590,in_stack_00000588);
  return bVar1;
}

Assistant:

bool KinDynComputations::getFrameFreeFloatingJacobianSparsityPattern(const FrameIndex frameIndex,
                                                                         iDynTree::MatrixDynSize & outJacobianPattern) const
    {
        outJacobianPattern.resize(6, 6 + getNrOfDegreesOfFreedom());

        return this->getFrameFreeFloatingJacobianSparsityPattern(frameIndex,
                                                                 MatrixView<double>(outJacobianPattern));
    }